

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_print(lua_State *L)

{
  long lVar1;
  long lVar2;
  cTValue *pcVar3;
  undefined4 *puVar4;
  uint uVar5;
  uint *puVar6;
  long in_RDI;
  char buf_1 [32];
  char *p;
  char buf [11];
  cTValue *o;
  size_t size;
  char *str;
  int shortcut;
  cTValue *tv;
  ptrdiff_t nargs;
  ptrdiff_t i;
  int in_stack_fffffffffffffef8;
  ErrMsg in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  lua_State *in_stack_ffffffffffffff10;
  size_t local_b8;
  char *local_b0;
  cTValue *local_a0;
  long local_90;
  
  lVar1 = *(long *)(in_RDI + 0x18);
  lVar2 = *(long *)(in_RDI + 0x10);
  local_a0 = lj_tab_getstr((GCtab *)(ulong)*(uint *)(in_RDI + 0x2c),
                           (GCstr *)(ulong)*(uint *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8)
                                                    + 0x20));
  if ((local_a0 == (cTValue *)0x0) || ((local_a0->field_2).it == 0xffffffff)) {
    puVar4 = *(undefined4 **)(in_RDI + 0x18);
    *(undefined4 **)(in_RDI + 0x18) = puVar4 + 2;
    *puVar4 = *(undefined4 *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8) + 0x20);
    puVar4[1] = 0xfffffffb;
    lua_gettable((lua_State *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 in_stack_ffffffffffffff04);
    local_a0 = (cTValue *)(*(long *)(in_RDI + 0x18) + -8);
  }
  else {
    pcVar3 = *(cTValue **)(in_RDI + 0x18);
    *(cTValue **)(in_RDI + 0x18) = pcVar3 + 1;
    pcVar3->u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)local_a0;
  }
  uVar7 = in_stack_ffffffffffffff04 & 0xffffff;
  if ((local_a0->field_2).it == 0xfffffff7) {
    uVar7 = CONCAT13(*(char *)((ulong)(local_a0->u32).lo + 6) == '\x13',
                     (int3)in_stack_ffffffffffffff04);
  }
  uVar5 = uVar7 >> 0x18;
  local_90 = 0;
  do {
    if (lVar1 - lVar2 >> 3 <= local_90) {
      putchar(10);
      return 0;
    }
    puVar6 = (uint *)(*(long *)(in_RDI + 0x10) + local_90 * 8);
    if ((uVar5 == 0) || (puVar6[1] != 0xfffffffb)) {
      if ((uVar5 == 0) || (0xfffefffe < puVar6[1])) {
        *(undefined8 *)(*(long *)(in_RDI + 0x18) + 8) = *(undefined8 *)puVar6;
        **(undefined8 **)(in_RDI + 0x18) = *(undefined8 *)(*(long *)(in_RDI + 0x18) + -8);
        *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 0x10;
        lua_call((lua_State *)CONCAT44(uVar7,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc,
                 in_stack_fffffffffffffef8);
        local_b0 = lua_tolstring(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                                 (size_t *)CONCAT44(uVar7,in_stack_ffffffffffffff00));
        if (local_b0 == (char *)0x0) {
          lj_err_caller((lua_State *)CONCAT44(uVar7,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffefc);
        }
        *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + -8;
      }
      else {
        local_b8 = lj_str_bufnum((char *)CONCAT44(in_stack_ffffffffffffff0c,
                                                  in_stack_ffffffffffffff08),
                                 (cTValue *)CONCAT44(uVar7,in_stack_ffffffffffffff00));
        local_b0 = &stack0xffffffffffffff08;
      }
    }
    else {
      local_b0 = (char *)((ulong)*puVar6 + 0x10);
      local_b8 = (size_t)*(uint *)((ulong)*puVar6 + 0xc);
    }
    if (local_90 != 0) {
      putchar(9);
    }
    fwrite(local_b0,1,local_b8,_stdout);
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

LJLIB_CF(print)
{
  ptrdiff_t i, nargs = L->top - L->base;
  cTValue *tv = lj_tab_getstr(tabref(L->env), strV(lj_lib_upvalue(L, 1)));
  int shortcut;
  if (tv && !tvisnil(tv)) {
    copyTV(L, L->top++, tv);
  } else {
    setstrV(L, L->top++, strV(lj_lib_upvalue(L, 1)));
    lua_gettable(L, LUA_GLOBALSINDEX);
    tv = L->top-1;
  }
  shortcut = (tvisfunc(tv) && funcV(tv)->c.ffid == FF_tostring);
  for (i = 0; i < nargs; i++) {
    const char *str;
    size_t size;
    cTValue *o = &L->base[i];
    if (shortcut && tvisstr(o)) {
      str = strVdata(o);
      size = strV(o)->len;
    } else if (shortcut && tvisint(o)) {
      char buf[LJ_STR_INTBUF];
      char *p = lj_str_bufint(buf, intV(o));
      size = (size_t)(buf+LJ_STR_INTBUF-p);
      str = p;
    } else if (shortcut && tvisnum(o)) {
      char buf[LJ_STR_NUMBUF];
      size = lj_str_bufnum(buf, o);
      str = buf;
    } else {
      copyTV(L, L->top+1, o);
      copyTV(L, L->top, L->top-1);
      L->top += 2;
      lua_call(L, 1, 1);
      str = lua_tolstring(L, -1, &size);
      if (!str)
	lj_err_caller(L, LJ_ERR_PRTOSTR);
      L->top--;
    }
    if (i)
      putchar('\t');
    fwrite(str, 1, size, stdout);
  }
  putchar('\n');
  return 0;
}